

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O2

UBool isSpecialTypeReorderCode(char *val)

{
  char c;
  UBool UVar1;
  int iVar2;
  
  iVar2 = 0;
  do {
    c = *val;
    if (c == '-') {
      if (iVar2 - 9U < 0xfffffffa) {
        return '\0';
      }
      iVar2 = 0;
    }
    else {
      if (c == '\0') {
        return iVar2 - 3U < 6;
      }
      UVar1 = uprv_isASCIILetter_63(c);
      if (UVar1 == '\0') {
        return '\0';
      }
      iVar2 = iVar2 + 1;
    }
    val = val + 1;
  } while( true );
}

Assistant:

static UBool
isSpecialTypeReorderCode(const char* val) {
    int32_t subtagLen = 0;
    const char* p = val;
    while (*p) {
        if (*p == '-') {
            if (subtagLen < 3 || subtagLen > 8) {
                return FALSE;
            }
            subtagLen = 0;
        } else if (uprv_isASCIILetter(*p)) {
            subtagLen++;
        } else {
            return FALSE;
        }
        p++;
    }
    return (subtagLen >=3 && subtagLen <=8);
}